

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O2

void __thiscall xLearn::Model::set_value(Model *this)

{
  float fVar1;
  index_t iVar2;
  uint uVar3;
  real_t *prVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  index_t d_1;
  uint uVar10;
  uint uVar11;
  index_t j_1;
  ulong uVar12;
  ulong uVar13;
  index_t j;
  ulong uVar14;
  float *pfVar15;
  index_t d;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  result_type_conflict rVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  param_type local_40;
  default_random_engine generator;
  
  generator._M_x = 1;
  local_40._M_a = 0.0;
  local_40._M_b = 1.0;
  uVar9 = this->param_num_w_;
  uVar12 = (ulong)this->aux_size_;
  prVar4 = this->param_w_;
  for (uVar13 = 0; (uint)uVar13 < uVar9; uVar13 = uVar13 + uVar12) {
    prVar4[uVar13 & 0xffffffff] = 0.0;
    for (uVar14 = 1; uVar14 < uVar12; uVar14 = uVar14 + 1) {
      prVar4[(uint)uVar13 + (int)uVar14] = 1.0;
    }
  }
  prVar4 = this->param_b_;
  *prVar4 = 0.0;
  for (uVar13 = 1; uVar13 < uVar12; uVar13 = uVar13 + 1) {
    prVar4[uVar13] = 1.0;
  }
  iVar8 = std::__cxx11::string::compare((char *)this);
  if (iVar8 == 0) {
    uVar9 = this->num_K_;
    pfVar15 = this->param_v_;
    uVar10 = 0;
    auVar21._8_8_ = in_XMM2_Qb;
    auVar21._0_8_ = in_XMM2_Qa;
    auVar21 = vcvtusi2ss_avx512f(auVar21,uVar9);
    auVar21 = ZEXT416((uint)(auVar21._0_4_ * 0.25));
    auVar21 = vroundss_avx(auVar21,auVar21,10);
    iVar8 = vcvttss2usi_avx512f(auVar21);
    auVar7._8_8_ = in_XMM2_Qb;
    auVar7._0_8_ = in_XMM2_Qa;
    auVar21 = vcvtusi2sd_avx512f(auVar7,uVar9);
    auVar21 = vsqrtsd_avx(auVar21,auVar21);
    uVar16 = iVar8 * 4;
    fVar1 = this->scale_;
    for (; uVar10 < this->num_feat_; uVar10 = uVar10 + 1) {
      for (uVar18 = 0; uVar17 = uVar9, uVar18 < uVar9; uVar18 = uVar18 + 1) {
        rVar19 = std::uniform_real_distribution<float>::operator()
                           ((uniform_real_distribution<float> *)&local_40,&generator);
        *pfVar15 = rVar19 * (float)((1.0 / auVar21._0_8_) * (double)fVar1);
        pfVar15 = pfVar15 + 1;
        uVar9 = this->num_K_;
      }
      for (; uVar17 < uVar16; uVar17 = uVar17 + 1) {
        *pfVar15 = 0.0;
        pfVar15 = pfVar15 + 1;
      }
      iVar2 = this->aux_size_;
      for (uVar18 = uVar16; uVar18 < iVar2 * uVar16; uVar18 = uVar18 + 1) {
        *pfVar15 = 1.0;
        pfVar15 = pfVar15 + 1;
      }
    }
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)this);
    if (iVar8 == 0) {
      pfVar15 = this->param_v_;
      auVar5._8_8_ = in_XMM2_Qb;
      auVar5._0_8_ = in_XMM2_Qa;
      auVar21 = vcvtusi2ss_avx512f(auVar5,this->num_K_);
      auVar21 = ZEXT416((uint)(auVar21._0_4_ * 0.25));
      auVar21 = vroundss_avx(auVar21,auVar21,10);
      iVar8 = vcvttss2usi_avx512f(auVar21);
      auVar6._8_8_ = in_XMM2_Qb;
      auVar6._0_8_ = in_XMM2_Qa;
      auVar21 = vcvtusi2sd_avx512f(auVar6,this->num_K_);
      uVar9 = 0;
      auVar21 = vsqrtsd_avx(auVar21,auVar21);
      fVar1 = this->scale_;
      for (; uVar9 < this->num_feat_; uVar9 = uVar9 + 1) {
        for (uVar10 = 0; uVar10 < this->num_field_; uVar10 = uVar10 + 1) {
          uVar16 = 4;
          for (uVar18 = 0; uVar17 = uVar18, uVar18 < (uint)(iVar8 << 2); uVar18 = uVar18 + 4) {
            for (; uVar17 != uVar16; uVar17 = uVar17 + 1) {
              fVar20 = 0.0;
              if (uVar17 < this->num_K_) {
                rVar19 = std::uniform_real_distribution<float>::operator()
                                   ((uniform_real_distribution<float> *)&local_40,&generator);
                fVar20 = rVar19 * (float)((1.0 / auVar21._0_8_) * (double)fVar1);
              }
              *pfVar15 = fVar20;
              uVar3 = this->aux_size_;
              uVar11 = 4;
              for (uVar12 = 1; uVar12 < uVar3; uVar12 = uVar12 + 1) {
                uVar13 = (ulong)uVar11;
                uVar11 = uVar11 + 4;
                pfVar15[uVar13] = 1.0;
              }
              pfVar15 = pfVar15 + 1;
            }
            uVar16 = uVar16 + 4;
            pfVar15 = pfVar15 + (this->aux_size_ * 4 - 4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Model::set_value() {
  // Use distribution to transform the random unsigned
  // int generated by gen into a float in [(0.0, 1.0) * coef]
  std::default_random_engine generator;
  std::uniform_real_distribution<real_t> dis(0.0, 1.0);
  /*********************************************************
   *  Initialize linear and bias term                      *
   *********************************************************/
  for (index_t i = 0; i < param_num_w_; i += aux_size_) {
    param_w_[i] = 0.0;        /* model */
    for (index_t j = 1; j < aux_size_; ++j) {
      param_w_[i+j] = 1.0;    /* gradient cache */
    }
  }
  param_b_[0] = 0.0;      /* model */
  for (index_t j = 1; j < aux_size_; ++j) {
    param_b_[j] = 1.0;    /* gradient cache */
  }
  /*********************************************************
   *  Initialize latent factor for fm                      *
   *********************************************************/
  if (score_func_.compare("fm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t coef = 1.0f / sqrt(num_K_) * scale_;
    real_t* w = param_v_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for(index_t d = 0; d < num_K_; d++, w++) {
        *w = coef * dis(generator);  /* model */
      }
      for(index_t d = num_K_; d < k_aligned; d++, w++) {
        *w = 0;  /* Beyond aligned number */
      }
      for(index_t d = k_aligned; d < aux_size_*k_aligned; d++, w++) {
        *w = 1.0;  /* gradient cache */
      }
    }
  }
  /*********************************************************
   *  Initialize latent factor for ffm                     *
   *********************************************************/
  else if (score_func_.compare("ffm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t* w = param_v_;
    real_t coef = 1.0f / sqrt(num_K_) * scale_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for (index_t f = 0; f < num_field_; ++f) {
        for (index_t d = 0; d < k_aligned; ) {
          for (index_t s = 0; s < kAlign; s++, w++, d++) {
            w[0] = (d < num_K_) ? coef * dis(generator) : 0.0; /* model */
            for (index_t j = 1; j < aux_size_; ++j) {
              w[kAlign * j] = 1.0; /* gradient cache */
            }
          }
          w += (aux_size_-1) * kAlign;
        }
      }
    }
  }
}